

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void test_iterator_reuse_retry_count(int retry_count)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  bool bVar3;
  _Bool _Var4;
  roaring_bitmap_t *prVar5;
  roaring_bitmap_t *r;
  uint64_t uVar6;
  uint64_t uVar7;
  roaring_bitmap_t **pprVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint32_t *ref_values;
  uint32_t ref_count;
  roaring_uint32_iterator_t iterator;
  uint32_t *local_80;
  roaring_bitmap_t *local_78;
  roaring_bitmap_t *local_70;
  uint local_64;
  roaring_uint32_iterator_t local_60;
  roaring_bitmap_t *local_38;
  
  test_iterator_generate_data(&local_80,&local_64);
  prVar5 = roaring_bitmap_create_with_capacity(0);
  r = roaring_bitmap_create_with_capacity(0);
  puVar1 = local_80;
  if ((ulong)local_64 != 0) {
    uVar12 = 0;
    do {
      roaring_bitmap_add(prVar5,puVar1[uVar12]);
      if ((uVar12 != 0) && (local_64 - 1 != uVar12)) {
        roaring_bitmap_add(r,puVar1[uVar12]);
      }
      uVar12 = uVar12 + 1;
    } while (local_64 != uVar12);
  }
  _Var4 = roaring_bitmap_contains(prVar5,0);
  _assert_true((ulong)_Var4,"roaring_bitmap_contains(with_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff7);
  _Var4 = roaring_bitmap_contains(prVar5,0xffffffff);
  _assert_true((ulong)_Var4,"roaring_bitmap_contains(with_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff8);
  _Var4 = roaring_bitmap_contains(r,0);
  _assert_true((ulong)!_Var4,"!roaring_bitmap_contains(without_edges, 0)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xff9);
  _Var4 = roaring_bitmap_contains(r,0xffffffff);
  _assert_true((ulong)!_Var4,"!roaring_bitmap_contains(without_edges, UINT32_MAX)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffa);
  uVar6 = roaring_bitmap_get_cardinality(prVar5);
  uVar7 = roaring_bitmap_get_cardinality(r);
  _assert_true((ulong)(uVar6 - 2 == uVar7),
               "roaring_bitmap_get_cardinality(with_edges) - 2 == roaring_bitmap_get_cardinality(without_edges)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xffc);
  pprVar8 = &local_38;
  local_38 = prVar5;
  local_70 = r;
  bVar3 = true;
  local_78 = prVar5;
  do {
    bVar9 = bVar3;
    prVar5 = *pprVar8;
    roaring_iterator_init(prVar5,&local_60);
    _assert_true((ulong)local_60.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1004);
    uVar2 = local_60.current_value;
    if (local_60.has_value == true) {
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        roaring_uint32_iterator_advance(&local_60);
      } while (local_60.has_value != false);
      uVar6 = (uint64_t)uVar10;
    }
    else {
      uVar6 = 0;
    }
    uVar7 = roaring_bitmap_get_cardinality(prVar5);
    _assert_true((ulong)(uVar7 == uVar6),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x100c);
    iVar11 = retry_count;
    if (0 < retry_count) {
      do {
        roaring_uint32_iterator_advance(&local_60);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    roaring_uint32_iterator_previous(&local_60);
    if (local_60.has_value == true) {
      uVar10 = 0;
      do {
        uVar10 = uVar10 + 1;
        roaring_uint32_iterator_previous(&local_60);
      } while (local_60.has_value != false);
      uVar6 = (uint64_t)uVar10;
    }
    else {
      uVar6 = 0;
    }
    uVar7 = roaring_bitmap_get_cardinality(prVar5);
    _assert_true((ulong)(uVar7 == uVar6),"count == roaring_bitmap_get_cardinality(bitmaps[i])",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x101a);
    iVar11 = retry_count;
    if (0 < retry_count) {
      do {
        roaring_uint32_iterator_previous(&local_60);
        iVar11 = iVar11 + -1;
      } while (iVar11 != 0);
    }
    roaring_uint32_iterator_advance(&local_60);
    _assert_true((ulong)local_60.has_value,"iterator.has_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1022);
    _assert_true((ulong)(uVar2 == local_60.current_value),"first_value == iterator.current_value",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
                 ,0x1023);
    pprVar8 = &local_70;
    bVar3 = false;
  } while (bVar9);
  roaring_bitmap_free(r);
  roaring_bitmap_free(local_78);
  free(local_80);
  return;
}

Assistant:

void test_iterator_reuse_retry_count(int retry_count) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *with_edges = roaring_bitmap_create();
    // We don't want min and max values inside this bitmap
    roaring_bitmap_t *without_edges = roaring_bitmap_create();

    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(with_edges, ref_values[i]);
        if (i != 0 && i != ref_count - 1) {
            roaring_bitmap_add(without_edges, ref_values[i]);
        }
    }

    // sanity checks
    assert_true(roaring_bitmap_contains(with_edges, 0));
    assert_true(roaring_bitmap_contains(with_edges, UINT32_MAX));
    assert_true(!roaring_bitmap_contains(without_edges, 0));
    assert_true(!roaring_bitmap_contains(without_edges, UINT32_MAX));
    assert_true(roaring_bitmap_get_cardinality(with_edges) - 2 ==
                roaring_bitmap_get_cardinality(without_edges));

    const roaring_bitmap_t *bitmaps[] = {with_edges, without_edges};
    int num_bitmaps = sizeof(bitmaps) / sizeof(bitmaps[0]);

    for (int i = 0; i < num_bitmaps; ++i) {
        roaring_uint32_iterator_t iterator;
        roaring_iterator_init(bitmaps[i], &iterator);
        assert_true(iterator.has_value);
        uint32_t first_value = iterator.current_value;

        uint32_t count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_advance(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test advancing the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_advance(&iterator);
        }

        // Using same iterator we want to go backwards through the list
        roaring_uint32_iterator_previous(&iterator);
        count = 0;
        while (iterator.has_value) {
            count++;
            roaring_uint32_iterator_previous(&iterator);
        }
        assert_true(count == roaring_bitmap_get_cardinality(bitmaps[i]));

        // Test decrement the iterator more times than necessary
        for (int retry = 0; retry < retry_count; ++retry) {
            roaring_uint32_iterator_previous(&iterator);
        }

        roaring_uint32_iterator_advance(&iterator);
        assert_true(iterator.has_value);
        assert_true(first_value == iterator.current_value);
    }

    roaring_bitmap_free(without_edges);
    roaring_bitmap_free(with_edges);
    free(ref_values);
}